

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_function::statement_function
          (statement_function *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body,
          bool is_override,bool is_vargs,context_t *c,token_base *ptr)

{
  byte bVar1;
  context_t *in_RCX;
  statement_base *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  shared_ptr<cs::context_type> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  function *in_stack_ffffffffffffff50;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffffb8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffffc0;
  
  bVar1 = (byte)in_R8D;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)CONCAT44(in_R8D,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  statement_base::statement_base
            (in_RDX,in_RCX,(token_base *)CONCAT44(in_R8D,in_stack_ffffffffffffff00));
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x242fe8);
  *in_RDI = &PTR__statement_function_003be708;
  std::__cxx11::string::string((string *)(in_RDI + 4),in_RSI);
  body_00 = (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)(in_RDI + 8);
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)CONCAT44(in_R8D,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  cs::function::function
            (in_stack_ffffffffffffff50,(context_t *)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40,body_00,SUB81((ulong)in_RDI >> 0x38,0),
             SUB81((ulong)in_RDI >> 0x30,0));
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDX);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x2430b1);
  *(byte *)(in_RDI + 0x19) = bVar1 & 1;
  *(undefined1 *)((long)in_RDI + 0xc9) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

statement_function(std::string name, const std::vector<std::string> &args,
		                   const std::deque<statement_base *> &body, bool is_override, bool is_vargs,
		                   const context_t &c,
		                   token_base *ptr)
			: statement_base(c, ptr), mName(std::move(name)), mFunc(c, args, body, is_vargs),
			  mOverride(is_override),
			  mArgs(args),
			  mBlock(body) {}